

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O3

int json_object_update_existing(json_t *object,json_t *other)

{
  void *pvVar1;
  char *key;
  json_t *value;
  int iVar2;
  char *iter;
  json_object_t *object_1;
  size_t local_48;
  
  iVar2 = -1;
  if ((((object != (json_t *)0x0) && (other != (json_t *)0x0)) && (object->type == JSON_OBJECT)) &&
     (other->type == JSON_OBJECT)) {
    pvVar1 = hashtable_iter((hashtable_t *)(other + 2));
    iVar2 = 0;
    if ((pvVar1 != (void *)0x0) && (key = (char *)hashtable_iter_key(pvVar1), key != (char *)0x0)) {
      iter = key + -0x28;
      local_48 = hashtable_iter_key_len(iter);
      value = (json_t *)hashtable_iter_value(iter);
      if (value != (json_t *)0x0) {
        do {
          if ((object->type == JSON_OBJECT) &&
             (pvVar1 = hashtable_get((hashtable_t *)(object + 2),key,local_48),
             pvVar1 != (void *)0x0)) {
            json_object_setn_new_nocheck(object,key,local_48,value);
          }
          if (other->type != JSON_OBJECT) {
            return 0;
          }
          pvVar1 = hashtable_iter_next((hashtable_t *)(other + 2),iter);
          if (pvVar1 == (void *)0x0) {
            return 0;
          }
          key = (char *)hashtable_iter_key(pvVar1);
          if (key == (char *)0x0) {
            return 0;
          }
          iter = key + -0x28;
          local_48 = hashtable_iter_key_len(iter);
          value = (json_t *)hashtable_iter_value(iter);
          iVar2 = 0;
        } while (value != (json_t *)0x0);
      }
    }
  }
  return iVar2;
}

Assistant:

int json_object_update_existing(json_t *object, json_t *other) {
    const char *key;
    size_t key_len;
    json_t *value;

    if (!json_is_object(object) || !json_is_object(other))
        return -1;

    json_object_keylen_foreach(other, key, key_len, value) {
        if (json_object_getn(object, key, key_len))
            json_object_setn_nocheck(object, key, key_len, value);
    }

    return 0;
}